

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

char * absolute_path_for_argument(char *arg)

{
  char *pcVar1;
  
  pcVar1 = realpath(arg,(char *)0x0);
  return pcVar1;
}

Assistant:

char * absolute_path_for_argument(const char * arg) {
	char * result = NULL;
#ifdef PATH_MAX
	// If PATH_MAX defined, use it
	char absolute[PATH_MAX + 1];
	realpath(arg, absolute);
	result = my_strdup(absolute);
#else
	// If undefined, then we *should* be able to use a NULL pointer to allocate
	result = realpath(arg, NULL);
#endif

	return result;
}